

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<256,_256>::CollectUnmarked(ObjectBlockPool<256,_256> *this)

{
  SmallBlock<256> **ppSVar1;
  MyLargeBlock *pMVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  LargeBlock<256,_256> *pLVar6;
  uint newSize;
  FastVector<SmallBlock<256>_*,_false,_false> *this_00;
  SmallBlock<256> *pSVar7;
  ulong uVar8;
  SmallBlock<256> *local_48;
  FastVector<SmallBlock<256>_*,_false,_false> *local_40;
  FastVector<SmallBlock<256>_*,_false,_false> *local_38;
  
  pMVar2 = this->activePages;
  if (pMVar2 != (MyLargeBlock *)0x0) {
    local_38 = &this->objectsToFree;
    local_40 = &this->objectsToFinalize;
    uVar4 = (ulong)this->lastNum;
    pLVar6 = pMVar2;
    do {
      if ((pLVar6 != pMVar2) || (iVar3 = (int)uVar4, uVar4 = 0, iVar3 != 0)) {
        pSVar7 = pLVar6->page;
        uVar8 = 0;
        do {
          if ((pSVar7->marker & 3) == 0) {
            if (((uint)pSVar7->marker & 0xc) == 4) {
              newSize = (this->objectsToFinalize).count;
              this_00 = local_40;
              if (newSize != (this->objectsToFinalize).max) {
                ppSVar1 = (this->objectsToFinalize).data;
                (this->objectsToFinalize).count = newSize + 1;
LAB_0011ecb5:
                ppSVar1[newSize] = pSVar7;
                goto LAB_0011ecb9;
              }
            }
            else {
              newSize = (this->objectsToFree).count;
              this_00 = local_38;
              if (newSize != (this->objectsToFree).max) {
                ppSVar1 = (this->objectsToFree).data;
                (this->objectsToFree).count = newSize + 1;
                goto LAB_0011ecb5;
              }
            }
            local_48 = pSVar7;
            FastVector<SmallBlock<256>_*,_false,_false>::grow_and_add(this_00,newSize,&local_48);
          }
LAB_0011ecb9:
          uVar8 = uVar8 + 1;
          pMVar2 = this->activePages;
          uVar4 = (ulong)this->lastNum;
          uVar5 = 0x100;
          if (pLVar6 == pMVar2) {
            uVar5 = uVar4;
          }
          pSVar7 = pSVar7 + 1;
        } while (uVar8 < uVar5);
      }
      pLVar6 = pLVar6->next;
    } while (pLVar6 != (LargeBlock<256,_256> *)0x0);
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}